

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_footprints.cpp
# Opt level: O2

void __thiscall cp::PlanFootprints::calcNextFootprintOld(PlanFootprints *this)

{
  uint uVar1;
  double dVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  Vector3 swing_p;
  Quat swing_q;
  Quat waist_rot;
  Quat foot_rot;
  double local_e0;
  Matrix<double,_3,_1,_0,_3,_1> local_d8;
  Vector3 local_c0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  Quat local_88;
  QuaternionBase<Eigen::Quaternion<double,_0>_> local_68 [32];
  QuaternionBase<Eigen::Quaternion<double,_0>_> local_48 [32];
  
  whichWalkOrStep(this);
  if ((calcNextFootprintOld()::before_land_pos == '\0') &&
     (iVar3 = __cxa_guard_acquire(&calcNextFootprintOld()::before_land_pos), iVar3 != 0)) {
    calcNextFootprintOld::before_land_pos.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]._0_4_ =
         *(undefined4 *)(this + 0x2e8);
    calcNextFootprintOld::before_land_pos.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]._4_4_ =
         *(undefined4 *)(this + 0x2ec);
    calcNextFootprintOld::before_land_pos.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]._0_4_ =
         *(undefined4 *)(this + 0x2f0);
    calcNextFootprintOld::before_land_pos.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]._4_4_ =
         *(undefined4 *)(this + 0x2f4);
    calcNextFootprintOld::before_land_pos.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] = 0.0;
    __cxa_guard_release(&calcNextFootprintOld()::before_land_pos);
  }
  if ((calcNextFootprintOld()::before_land_dis == '\0') &&
     (iVar3 = __cxa_guard_acquire(&calcNextFootprintOld()::before_land_dis), iVar3 != 0)) {
    calcNextFootprintOld::before_land_dis.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]._0_4_ =
         *(undefined4 *)(this + 0x2e8);
    calcNextFootprintOld::before_land_dis.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]._4_4_ =
         *(undefined4 *)(this + 0x2ec);
    calcNextFootprintOld::before_land_dis.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]._0_4_ =
         *(undefined4 *)(this + 0x2f0);
    calcNextFootprintOld::before_land_dis.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]._4_4_ =
         *(undefined4 *)(this + 0x2f4);
    calcNextFootprintOld::before_land_dis.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] = 0.0;
    __cxa_guard_release(&calcNextFootprintOld()::before_land_dis);
  }
  local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       0.0;
  local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       0.0;
  uVar4 = calcNextFootprintOld::before_land_pos.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1].
          _0_4_;
  uVar5 = calcNextFootprintOld::before_land_pos.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1].
          _4_4_;
  switch(*(undefined4 *)(this + 0x308)) {
  case 1:
    dVar2 = (double)CONCAT44(calcNextFootprintOld::before_land_pos.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                             m_data.array[0]._4_4_,
                             calcNextFootprintOld::before_land_pos.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                             m_data.array[0]._0_4_);
    local_e0 = dVar2 + dVar2 + (*(double *)(this + 0x2e8) - dVar2);
    local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = local_e0;
    local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = isCollisionLegs(this,*(double *)(this + 0x2f0),
                           (double)CONCAT44(calcNextFootprintOld::before_land_dis.
                                            super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                            .m_storage.m_data.array[1]._4_4_,
                                            calcNextFootprintOld::before_land_dis.
                                            super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                                            .m_storage.m_data.array[1]._0_4_));
    goto LAB_0013716a;
  default:
    local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = 0.0;
    local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = 0.0;
    local_e0 = 0.0;
    goto LAB_0013716a;
  case 5:
    local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = *(double *)(this + 0x2e8);
    break;
  case 6:
  case 7:
  case 9:
    local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = *(double *)(this + 0x2e8);
    uVar4 = (int)*(undefined8 *)(this + 0x2f0);
    uVar5 = (int)((ulong)*(undefined8 *)(this + 0x2f0) >> 0x20);
    break;
  case 8:
    local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = (double)CONCAT44(calcNextFootprintOld::before_land_pos.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                            m_data.array[0]._4_4_,
                            calcNextFootprintOld::before_land_pos.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                            m_data.array[0]._0_4_);
    uVar6 = 0;
    uVar7 = 0;
    if ((0.0 <= (double)CONCAT44(calcNextFootprintOld::before_land_pos.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[1]._4_4_,
                                 calcNextFootprintOld::before_land_pos.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                 m_storage.m_data.array[1]._0_4_) || *(int *)(this + 0x2e0) != 0) &&
       ((double)CONCAT44(calcNextFootprintOld::before_land_pos.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                         m_data.array[1]._4_4_,
                         calcNextFootprintOld::before_land_pos.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                         m_data.array[1]._0_4_) < 0.0 || *(int *)(this + 0x2e0) != 1))
    goto LAB_0013715b;
    goto LAB_0013715f;
  }
  if ((((double)CONCAT44(uVar5,uVar4) <= 0.0 && (double)CONCAT44(uVar5,uVar4) != 0.0) &&
       *(int *)(this + 0x2e0) == 0) ||
     (uVar6 = 0, uVar7 = 0, 0.0 <= (double)CONCAT44(uVar5,uVar4) && *(int *)(this + 0x2e0) == 1)) {
LAB_0013715b:
    uVar6 = uVar4;
    uVar7 = uVar5;
  }
LAB_0013715f:
  local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (double)CONCAT44(uVar7,uVar6);
  local_e0 = local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
             array[0];
LAB_0013716a:
  dVar2 = local_d8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[1];
  rpy2q((Quat *)local_48,0.0,0.0,*(double *)(this + 0x300));
  rpy2q((Quat *)local_68,0.0,0.0,*(double *)(this + 0x300) * 0.5);
  uVar1 = *(uint *)(this + 0x2e0);
  local_c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       local_e0 + *(double *)(this + (ulong)uVar1 * 0xe0 + 0x10);
  local_c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       dVar2 + *(double *)(this + (ulong)uVar1 * 0xe0 + 0x18);
  local_c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       *(double *)(this + (ulong)uVar1 * 0xe0 + 800);
  Eigen::internal::
  quat_product<1,_Eigen::Quaternion<double,_0>,_Eigen::Quaternion<double,_0>,_double>::run
            ((QuaternionBase<Eigen::Quaternion<double,_0>_> *)(this + (ulong)uVar1 * 0xe0 + 0x30),
             local_48);
  Pose::set((Pose *)(this + (ulong)*(uint *)(this + 0x2e0) * 0xe0 + 0x10),&local_c0,&local_88);
  Eigen::internal::
  quat_product<1,_Eigen::Quaternion<double,_0>,_Eigen::Quaternion<double,_0>,_double>::run
            ((QuaternionBase<Eigen::Quaternion<double,_0>_> *)(this + 0x2b0),local_68);
  *(undefined8 *)(this + 0x2c0) = local_98;
  *(undefined8 *)(this + 0x2c8) = uStack_90;
  *(undefined8 *)(this + 0x2b0) = local_a8;
  *(undefined8 *)(this + 0x2b8) = uStack_a0;
  Eigen::internal::call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
            (&calcNextFootprintOld::before_land_pos,(Matrix<double,_3,_1,_0,_3,_1> *)(this + 0x2e8))
  ;
  Eigen::internal::call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
            (&calcNextFootprintOld::before_land_dis,&local_d8);
  return;
}

Assistant:

void PlanFootprints::calcNextFootprintOld() {
  whichWalkOrStep();
  static Vector3 before_land_pos(step_vector.x(), step_vector.y(), 0.0);
  static Vector3 before_land_dis(step_vector.x(), step_vector.y(), 0.0);

  // calc next step land position
  Vector3 next_land_distance(0.0, 0.0, 0.0);
  if (wstate == starting1 || wstate == starting2 || wstate == step2walk) {
    next_land_distance[0] = step_vector.x();
    next_land_distance[1] = isCollisionLegs(step_vector.y()) ? step_vector.y() : 0.0;
  } else if (wstate == stop_next) {  // walking stop
    next_land_distance[0] = step_vector.x();
    next_land_distance[1] =
        isCollisionLegs(before_land_pos.y()) ? before_land_pos.y() : 0.0;
  } else if (wstate == walk2step) {  // walk -> step
    next_land_distance[0] = before_land_pos.x();
    next_land_distance[1] =
        isCollisionLegs(before_land_pos.y()) ? 0.0 : before_land_pos.y();
  } else if (wstate == walk) {
    next_land_distance[0] =
        before_land_pos.x() * 2 + (step_vector.x() - before_land_pos.x());
    next_land_distance[1] = isCollisionLegs(step_vector.y(), before_land_dis.y());
  } else {
    next_land_distance[0] = 0.0;
    next_land_distance[1] = 0.0;
  }

  // calc next step land rotation
  Quat foot_rot = rpy2q(0.0, 0.0, step_angle);
  Quat waist_rot = rpy2q(0.0, 0.0, step_angle * 0.5);

  // swing leg
  Vector3 swing_p(
      ref_land_pose[swingleg].p().x() + next_land_distance[0],
      ref_land_pose[swingleg].p().y() + next_land_distance[1],
      init_feet_pose[swingleg].p().z());
  Quat swing_q = ref_land_pose[swingleg].q() * foot_rot;

  // set next landing position
  ref_land_pose[swingleg].set(swing_p, swing_q);
  ref_waist_r = ref_waist_r * waist_rot;

  before_land_pos = step_vector;
  before_land_dis = next_land_distance;
}